

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O0

size_t lj_utils_read_leb128_n(int64_t *out,uint8_t *buffer,size_t n)

{
  byte bVar1;
  size_t sVar2;
  size_t n_local;
  uint8_t *buffer_local;
  int64_t *out_local;
  uint8_t octet;
  int64_t value;
  uint64_t shift;
  size_t i;
  
  i = 0;
  shift = 0;
  value = 0;
  while ((n == 0 || (i + 1 <= n))) {
    sVar2 = i + 1;
    bVar1 = buffer[i];
    value = (long)(int)(bVar1 & 0x7f) << ((byte)shift & 0x3f) | value;
    shift = shift + 7;
    i = sVar2;
    if ((bVar1 & 0x80) == 0) {
      if (((bVar1 & 0x40) != 0) && (shift < 0x40)) {
        value = -(1 << ((byte)shift & 0x1f)) | value;
      }
      *out = value;
      return sVar2;
    }
  }
  return 0;
}

Assistant:

size_t LJ_FASTCALL lj_utils_read_leb128_n(int64_t *out, const uint8_t *buffer,
					  size_t n)
{
  return _read_leb128(out, buffer, n);
}